

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

_Bool regime_translation_disabled(CPUARMState_conflict *env,ARMMMUIdx mmu_idx)

{
  _Bool _Var1;
  int iVar2;
  uint uVar3;
  uint32_t uVar4;
  uint64_t uVar5;
  ARMMMUIdx mmu_idx_local;
  CPUARMState_conflict *env_local;
  
  iVar2 = arm_feature(env,9);
  if (iVar2 == 0) {
    if (mmu_idx == ARMMMUIdx_Stage2) {
      return ((env->cp15).hcr_el2 & 0x1001) == 0;
    }
    if (((((env->cp15).hcr_el2 & 0x8000000) != 0) && (_Var1 = regime_is_secure(env,mmu_idx), !_Var1)
        ) && (uVar4 = regime_el(env,mmu_idx), uVar4 == 1)) {
      return true;
    }
    if ((((env->cp15).hcr_el2 & 0x1000) != 0) &&
       (_Var1 = arm_mmu_idx_is_stage1_of_2(mmu_idx), _Var1)) {
      return true;
    }
    uVar5 = regime_sctlr(env,mmu_idx);
    return (uVar5 & 1) == 0;
  }
  _Var1 = regime_is_secure(env,mmu_idx);
  uVar3 = (env->v7m).mpu_ctrl[_Var1] & 3;
  if (uVar3 != 0) {
    if (uVar3 == 1) {
      return (mmu_idx & 2) != 0;
    }
    if (uVar3 == 3) {
      return false;
    }
  }
  return true;
}

Assistant:

static inline bool regime_translation_disabled(CPUARMState *env,
                                               ARMMMUIdx mmu_idx)
{
    if (arm_feature(env, ARM_FEATURE_M)) {
        switch (env->v7m.mpu_ctrl[regime_is_secure(env, mmu_idx)] &
                (R_V7M_MPU_CTRL_ENABLE_MASK | R_V7M_MPU_CTRL_HFNMIENA_MASK)) {
        case R_V7M_MPU_CTRL_ENABLE_MASK:
            /* Enabled, but not for HardFault and NMI */
            return mmu_idx & ARM_MMU_IDX_M_NEGPRI;
        case R_V7M_MPU_CTRL_ENABLE_MASK | R_V7M_MPU_CTRL_HFNMIENA_MASK:
            /* Enabled for all cases */
            return false;
        case 0:
        default:
            /* HFNMIENA set and ENABLE clear is UNPREDICTABLE, but
             * we warned about that in armv7m_nvic.c when the guest set it.
             */
            return true;
        }
    }

    if (mmu_idx == ARMMMUIdx_Stage2) {
        /* HCR.DC means HCR.VM behaves as 1 */
        return (env->cp15.hcr_el2 & (HCR_DC | HCR_VM)) == 0;
    }

    if (env->cp15.hcr_el2 & HCR_TGE) {
        /* TGE means that NS EL0/1 act as if SCTLR_EL1.M is zero */
        if (!regime_is_secure(env, mmu_idx) && regime_el(env, mmu_idx) == 1) {
            return true;
        }
    }

    if ((env->cp15.hcr_el2 & HCR_DC) && arm_mmu_idx_is_stage1_of_2(mmu_idx)) {
        /* HCR.DC means SCTLR_EL1.M behaves as 0 */
        return true;
    }

    return (regime_sctlr(env, mmu_idx) & SCTLR_M) == 0;
}